

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount)

{
  kj *this_00;
  uint in_ECX;
  ulong uVar1;
  size_t elementCount;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar2;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  kj *pkVar3;
  size_t sVar4;
  undefined8 *local_168;
  kj local_158 [320];
  
  elementCount = (ulong)ignoreCount + 0x21;
  if (ignoreCount < 8) {
    pkVar3 = (kj *)0x0;
    sVar4 = 0;
    local_168 = (undefined8 *)0x0;
    this_00 = local_158;
  }
  else {
    in_ECX = 0;
    this_00 = (kj *)kj::_::HeapArrayDisposer::allocateImpl
                              (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
    local_168 = &kj::_::HeapArrayDisposer::instance;
    pkVar3 = this_00;
    sVar4 = elementCount;
  }
  space.size_._0_4_ = ignoreCount + 1;
  space.ptr = (void **)elementCount;
  space.size_._4_4_ = 0;
  AVar2 = getStackTrace(this_00,space,in_ECX);
  space.size_ = AVar2.size_;
  if (ignoreCount + 2 < space.size_) {
    uVar1 = 0x20 - (ulong)this->traceCount;
    if (space.size_ <= uVar1) {
      uVar1 = space.size_;
    }
    memcpy(this->trace + this->traceCount,AVar2.ptr,uVar1 * 8);
    this->traceCount = this->traceCount + (int)uVar1;
  }
  if (pkVar3 != (kj *)0x0) {
    (**(code **)*local_168)(local_168,pkVar3,8,sVar4,sVar4,0,0,0);
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount) {
  KJ_STACK_ARRAY(void*, newTraceSpace, kj::size(trace) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.slice(0, kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
  }
}